

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-flat-test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_160658::InterfaceTester_QuadraticConstraint_Pow2_isMultipliedOutAndInlined_Test::
TestBody(InterfaceTester_QuadraticConstraint_Pow2_isMultipliedOutAndInlined_Test *this)

{
  bool bVar1;
  MP_NumExpr extraout_RDX;
  ModelAPIType *this_00;
  char *in_R9;
  NumExpr NVar2;
  NumExpr NVar3;
  NumExpr e1;
  NumExpr e1_00;
  NumExpr e2;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<double> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  AlgConRange rr;
  allocator_type local_7e3;
  allocator_type local_7e2;
  allocator_type local_7e1;
  AssertHelper local_7e0;
  int local_7d8;
  _Vector_base<int,_std::allocator<int>_> local_7d0;
  EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_> modeler;
  AssertionResult gtest_ar_;
  string local_798;
  vector<int,_std::allocator<int>_> xi;
  vector<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
  x;
  int local_73c;
  int local_738;
  int local_734;
  LinTerms lt;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> local_6b8;
  LinTerms local_4d0;
  QuadTerms qt;
  QuadTerms local_318;
  QuadAndLinTerms local_1d8;
  
  modeler.pb_ = &(this->super_InterfaceTester_QuadraticConstraint).interface_.
                 super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 .model_;
  mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::AddVars
            (&x,&modeler,3,-1.0,11.0,CONTINUOUS);
  NVar2.expr_.super_ExprBase.impl_ = extraout_RDX.super_ExprBase.impl_;
  NVar2.bld_ = (Builder *)
               ((x.
                 super__Vector_base<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
                 ._M_impl.super__Vector_impl_data._M_start)->expr_).super_ExprBase.impl_;
  NVar2 = mp::operator*((mp *)(x.
                               super__Vector_base<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bld_,8.0,NVar2);
  NVar3.expr_ = NVar2.expr_.super_ExprBase.impl_;
  NVar3.bld_ = (Builder *)
               x.
               super__Vector_base<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
               ._M_impl.super__Vector_impl_data._M_start[1].expr_.super_ExprBase.impl_;
  NVar3 = mp::operator*((mp *)x.
                              super__Vector_base<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].bld_,2.0,NVar3);
  NVar2 = mp::operator+(NVar2,NVar3);
  e1.expr_ = NVar2.expr_.super_ExprBase.impl_;
  e1.bld_ = (Builder *)e1.expr_.super_ExprBase.impl_;
  NVar2 = mp::operator+((mp *)NVar2.bld_,e1,3.0);
  e1_00.expr_ = NVar2.expr_.super_ExprBase.impl_;
  e1_00.bld_ = (Builder *)e1_00.expr_.super_ExprBase.impl_;
  NVar2 = mp::operator^((mp *)NVar2.bld_,e1_00,2.0);
  e2.expr_ = NVar2.expr_.super_ExprBase.impl_;
  e2.bld_ = (Builder *)
            x.
            super__Vector_base<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
            ._M_impl.super__Vector_impl_data._M_start[2].expr_.super_ExprBase.impl_;
  NVar3 = mp::operator*((mp *)x.
                              super__Vector_base<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
                              ._M_impl.super__Vector_impl_data._M_start[2].bld_,3.5,e2);
  NVar2 = mp::operator+(NVar2,NVar3);
  mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::AddAlgCon
            (&modeler,5.0,NVar2,INFINITY);
  (*(this->super_InterfaceTester_QuadraticConstraint).interface_.
    super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    .
    super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    .
    super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    .
    super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
    ._vptr_BasicExprVisitor[2])(&(this->super_InterfaceTester_QuadraticConstraint).interface_);
  mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::GetVarIndices(&xi,&modeler,&x);
  qt.folded_.super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
  m_data.super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
  m_data_ptr = (ptr)0x4048000000000000;
  qt.folded_.super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
  m_data.super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
  m_capacity = 0x4028000000000000;
  qt.folded_.super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
  m_data.super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
  m_size = 0x400c000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&qt;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_6b8,__l,(allocator_type *)&local_7d0)
  ;
  gtest_ar_._0_8_ =
       *(undefined8 *)
        xi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  gtest_ar_.message_.ptr_._0_4_ =
       xi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[2];
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&gtest_ar_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_798,__l_00,(allocator_type *)&local_7e0);
  mp::LinTerms::LinTerms
            (&lt,(vector<double,_std::allocator<double>_> *)&local_6b8,
             (vector<int,_std::allocator<int>_> *)&local_798);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_798);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_6b8);
  local_798._M_dataplus._M_p = (char *)0x4050000000000000;
  local_798._M_string_length = 0x4010000000000000;
  local_798.field_2._M_allocated_capacity = 0x4040000000000000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_798;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_6b8,__l_01,&local_7e1);
  local_7e0.data_ =
       *(AssertHelperData **)
        xi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_7d8 = *xi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_7e0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_,__l_02,&local_7e2);
  local_73c = *xi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
  local_738 = xi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[1];
  __l_03._M_len = 3;
  __l_03._M_array = &local_73c;
  local_734 = local_738;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_7d0,__l_03,&local_7e3);
  mp::QuadTerms::QuadTerms
            (&qt,(vector<double,_std::allocator<double>_> *)&local_6b8,
             (vector<int,_std::allocator<int>_> *)&gtest_ar_,
             (vector<int,_std::allocator<int>_> *)&local_7d0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_7d0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&gtest_ar_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_6b8);
  mp::LinTerms::LinTerms(&local_4d0,&lt);
  mp::QuadTerms::QuadTerms(&local_318,&qt);
  mp::QuadAndLinTerms::QuadAndLinTerms(&local_1d8,&local_4d0,&local_318);
  rr.ub_ = INFINITY;
  rr.lb_ = -4.0;
  mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::AlgebraicConstraint
            (&local_6b8,&local_1d8,rr,true);
  this_00 = &(this->super_InterfaceTester_QuadraticConstraint).interface_.
             super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             .flat_cvt_.
             super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             .modelapi_;
  bVar1 = TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
          ::HasConstraint(this_00,&local_6b8);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::~AlgebraicConstraint(&local_6b8);
  mp::QuadAndLinTerms::~QuadAndLinTerms(&local_1d8);
  mp::QuadTerms::~QuadTerms(&local_318);
  mp::LinTerms::~LinTerms(&local_4d0);
  if (!bVar1) {
    testing::Message::Message((Message *)&local_7d0);
    TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>::
    GetConstraintsPrintout_abi_cxx11_((string *)&local_6b8,this_00);
    std::operator<<((ostream *)(local_7d0._M_impl.super__Vector_impl_data._M_start + 4),
                    (string *)&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_798,(internal *)&gtest_ar_,
               (AssertionResult *)
               "(GetBackend()).HasConstraint( mp::QuadConRange( { std::move(lt), std::move(qt) }, {-4.0, (__builtin_inff ())} ) )"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/converter-flat-test.cpp"
               ,0x35,local_798._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)&local_7d0);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    std::__cxx11::string::~string((string *)&local_798);
    std::__cxx11::string::~string((string *)&local_6b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_7d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  mp::QuadTerms::~QuadTerms(&qt);
  mp::LinTerms::~LinTerms(&lt);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&xi.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Vector_base<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
  ::~_Vector_base(&x.
                   super__Vector_base<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
                 );
  return;
}

Assistant:

TEST_F(InterfaceTester_QuadraticConstraint, Pow2_isMultipliedOutAndInlined) {
  auto modeler = mp::MakeEasyModeler(GetModel());
  auto x = modeler.AddVars(3, -1.0, 11.0);
  modeler.AddAlgCon(5.0,
                    ((8*x[0] + 2*x[1] + 3)^2)            // C++ operator precedence
                      + 3.5*x[2],
                    INFINITY);
  GetInterface().ConvertModel();
  const auto xi = modeler.GetVarIndices(x);
  auto lt = mp::LinTerms{ {48, 12, 3.5}, {xi[0], xi[1], xi[2]} };
  auto qt = mp::QuadTerms{ {64, 4, 32}, {xi[0], xi[1], xi[0]}, {xi[0], xi[1], xi[1]} };
  ASSERT_HAS_CONSTRAINT( GetBackend(), mp::QuadConRange(
    { std::move(lt), std::move(qt) },
    {-4.0, INFINITY} ) );
}